

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O1

int siamese_init_(int version)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 5;
  if (version == 5) {
    iVar1 = gf256_init_(2);
    if (iVar1 == 0) {
      m_Initialized = 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

SIAMESE_EXPORT int siamese_init_(int version)
{
    if (version != SIAMESE_VERSION)
        return Siamese_Disabled;

    if (0 != gf256_init())
        return Siamese_Disabled;

    m_Initialized = true;
    return Siamese_Success;
}